

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O3

void __thiscall icu_63::RegexCompile::nextChar(RegexCompile *this,RegexPatternChar *c)

{
  uint uVar1;
  UText *pUVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  UChar32 UVar6;
  uint uVar7;
  int64_t iVar8;
  long lVar9;
  int64_t index;
  UnicodeSet *this_00;
  int32_t offset;
  int32_t endIndex;
  uint local_3c;
  UText *local_38;
  uint local_30;
  
  pUVar2 = this->fRXPat->fPattern;
  if (pUVar2->nativeIndexingLimit < pUVar2->chunkOffset) {
    iVar8 = (*pUVar2->pFuncs->mapOffsetToNative)(pUVar2);
  }
  else {
    iVar8 = (long)pUVar2->chunkOffset + pUVar2->chunkNativeStart;
  }
  this->fScanIndex = iVar8;
  iVar4 = nextCharLL(this);
  c->fChar = iVar4;
  c->fQuoted = '\0';
  if (this->fQuoteMode == '\0') {
    if (this->fInBackslashQuote != '\0') {
      this->fInBackslashQuote = '\0';
      goto LAB_001692f0;
    }
    if ((this->fModeFlags & 4) != 0) {
      do {
        if (iVar4 == 0x23) {
          iVar4 = 0x23;
          if (this->fEOLComments == '\x01') {
            do {
              iVar4 = nextCharLL(this);
              c->fChar = iVar4;
              if (((iVar4 + 1U < 0xf) && ((0x4801U >> (iVar4 + 1U & 0x1f) & 1) != 0)) ||
                 (iVar4 == 0x2028)) break;
            } while (iVar4 != 0x85);
          }
        }
        else if (iVar4 == -1) goto LAB_001692f0;
        UVar3 = PatternProps::isWhiteSpace(iVar4);
        if (UVar3 == '\0') goto LAB_00169364;
        iVar4 = nextCharLL(this);
        c->fChar = iVar4;
      } while( true );
    }
    goto LAB_00169367;
  }
  c->fQuoted = '\x01';
  if (iVar4 == 0x5c) {
    iVar5 = this->fPeekChar;
    iVar4 = 0x5c;
    if (iVar5 == -1) {
      iVar5 = nextCharLL(this);
      this->fPeekChar = iVar5;
      iVar4 = c->fChar;
    }
    if (iVar5 != 0x45) goto LAB_001692c8;
    if (iVar4 != -1 && (this->fModeFlags & 0x10) != 0) goto LAB_001692f0;
  }
  else {
LAB_001692c8:
    if (iVar4 != -1) goto LAB_001692f0;
  }
  this->fQuoteMode = '\0';
LAB_001692d1:
  nextCharLL(this);
  nextChar(this,c);
LAB_001692f0:
  this->fEOLComments = '\x01';
  return;
LAB_00169364:
  iVar4 = c->fChar;
LAB_00169367:
  if (iVar4 != 0x5c) goto LAB_001692f0;
  pUVar2 = this->fRXPat->fPattern;
  if (pUVar2->nativeIndexingLimit < pUVar2->chunkOffset) {
    iVar8 = (*pUVar2->pFuncs->mapOffsetToNative)(pUVar2);
  }
  else {
    iVar8 = (long)pUVar2->chunkOffset + pUVar2->chunkNativeStart;
  }
  this_00 = (UnicodeSet *)(RegexStaticSets::gStaticSets + 0x578);
  iVar4 = this->fPeekChar;
  if (iVar4 == -1) {
    iVar4 = nextCharLL(this);
    this->fPeekChar = iVar4;
  }
  UVar3 = UnicodeSet::contains(this_00,iVar4);
  if (UVar3 != '\0') {
    nextCharLL(this);
    c->fQuoted = '\x01';
    pUVar2 = this->fRXPat->fPattern;
    if (((pUVar2->chunkNativeStart == 0) &&
        (lVar9 = this->fPatternLength, lVar9 == pUVar2->chunkNativeLimit)) &&
       (lVar9 == pUVar2->nativeIndexingLimit)) {
      local_38 = (UText *)CONCAT44(local_38._4_4_,(int)iVar8);
      UVar6 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,(int32_t *)&local_38,(int32_t)lVar9,
                              pUVar2->chunkContents);
      c->fChar = UVar6;
      index = (int64_t)(int)local_38;
      if (iVar8 == index) {
        error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
        index = (int64_t)(int)local_38;
      }
      this->fCharNum = this->fCharNum + (index - iVar8);
      pUVar2 = this->fRXPat->fPattern;
      lVar9 = index - pUVar2->chunkNativeStart;
      if (((lVar9 < 0) || (pUVar2->nativeIndexingLimit <= lVar9)) ||
         (0xdbff < (ushort)pUVar2->chunkContents[lVar9])) {
        utext_setNativeIndex_63(pUVar2,index);
      }
      else {
        pUVar2->chunkOffset = (int32_t)lVar9;
      }
    }
    else {
      local_3c = 0;
      local_30 = 0xffffffff;
      lVar9 = iVar8 - pUVar2->chunkNativeStart;
      local_38 = pUVar2;
      if (((lVar9 < 0) || (pUVar2->nativeIndexingLimit <= lVar9)) ||
         (0xdbff < (ushort)pUVar2->chunkContents[lVar9])) {
        utext_setNativeIndex_63(pUVar2,iVar8);
      }
      else {
        pUVar2->chunkOffset = (int32_t)lVar9;
      }
      UVar6 = u_unescapeAt_63(uregex_utext_unescape_charAt_63,(int32_t *)&local_3c,0x7fffffff,
                              &local_38);
      c->fChar = UVar6;
      if (local_3c == 0) {
        error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
      }
      else if (local_30 == local_3c) {
        pUVar2 = this->fRXPat->fPattern;
        iVar4 = pUVar2->chunkOffset;
        if (((long)iVar4 < 1) || (0xd7ff < (ushort)pUVar2->chunkContents[(long)iVar4 + -1])) {
          utext_previous32_63(pUVar2);
        }
        else {
          pUVar2->chunkOffset = iVar4 + -1;
        }
      }
      else if (local_30 != local_3c - 1) {
        utext_moveIndex32_63(this->fRXPat->fPattern,local_3c + ~local_30);
      }
      this->fCharNum = this->fCharNum + (long)(int)local_3c;
    }
    goto LAB_001692f0;
  }
  iVar4 = this->fPeekChar;
  if (iVar4 == -1) {
    iVar4 = nextCharLL(this);
    this->fPeekChar = iVar4;
  }
  if (iVar4 == -1) {
    iVar4 = nextCharLL(this);
    this->fPeekChar = iVar4;
  }
  else if (iVar4 == 0x30) {
    c->fChar = 0;
    nextCharLL(this);
    iVar4 = 0;
    do {
      uVar7 = this->fPeekChar;
      if (uVar7 == 0xffffffff) {
        uVar7 = nextCharLL(this);
        this->fPeekChar = uVar7;
      }
      if (uVar7 - 0x38 < 0xfffffff8) {
        if (iVar4 == 0) {
          error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
        }
        break;
      }
      uVar1 = c->fChar;
      iVar5 = (uVar7 & 7) + uVar1 * 8;
      c->fChar = iVar5;
      if (iVar5 < 0x100) {
        nextCharLL(this);
      }
      else {
        c->fChar = uVar1 & 0x1fffffff;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != -3);
    c->fQuoted = '\x01';
    goto LAB_001692f0;
  }
  if (iVar4 != 0x51) {
    this->fInBackslashQuote = '\x01';
    goto LAB_001692f0;
  }
  this->fQuoteMode = '\x01';
  goto LAB_001692d1;
}

Assistant:

void RegexCompile::nextChar(RegexPatternChar &c) {

    fScanIndex = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
    c.fChar    = nextCharLL();
    c.fQuoted  = FALSE;

    if (fQuoteMode) {
        c.fQuoted = TRUE;
        if ((c.fChar==chBackSlash && peekCharLL()==chE && ((fModeFlags & UREGEX_LITERAL) == 0)) ||
            c.fChar == (UChar32)-1) {
            fQuoteMode = FALSE;  //  Exit quote mode,
            nextCharLL();        // discard the E
            nextChar(c);         // recurse to get the real next char
        }
    }
    else if (fInBackslashQuote) {
        // The current character immediately follows a '\'
        // Don't check for any further escapes, just return it as-is.
        // Don't set c.fQuoted, because that would prevent the state machine from
        //    dispatching on the character.
        fInBackslashQuote = FALSE;
    }
    else
    {
        // We are not in a \Q quoted region \E of the source.
        //
        if (fModeFlags & UREGEX_COMMENTS) {
            //
            // We are in free-spacing and comments mode.
            //  Scan through any white space and comments, until we
            //  reach a significant character or the end of inut.
            for (;;) {
                if (c.fChar == (UChar32)-1) {
                    break;     // End of Input
                }
                if  (c.fChar == chPound && fEOLComments == TRUE) {
                    // Start of a comment.  Consume the rest of it, until EOF or a new line
                    for (;;) {
                        c.fChar = nextCharLL();
                        if (c.fChar == (UChar32)-1 ||  // EOF
                            c.fChar == chCR        ||
                            c.fChar == chLF        ||
                            c.fChar == chNEL       ||
                            c.fChar == chLS)       {
                            break;
                        }
                    }
                }
                // TODO:  check what Java & Perl do with non-ASCII white spaces.  Ticket 6061.
                if (PatternProps::isWhiteSpace(c.fChar) == FALSE) {
                    break;
                }
                c.fChar = nextCharLL();
            }
        }

        //
        //  check for backslash escaped characters.
        //
        if (c.fChar == chBackSlash) {
            int64_t pos = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
            if (RegexStaticSets::gStaticSets->fUnescapeCharSet.contains(peekCharLL())) {
                //
                // A '\' sequence that is handled by ICU's standard unescapeAt function.
                //   Includes \uxxxx, \n, \r, many others.
                //   Return the single equivalent character.
                //
                nextCharLL();                 // get & discard the peeked char.
                c.fQuoted = TRUE;

                if (UTEXT_FULL_TEXT_IN_CHUNK(fRXPat->fPattern, fPatternLength)) {
                    int32_t endIndex = (int32_t)pos;
                    c.fChar = u_unescapeAt(uregex_ucstr_unescape_charAt, &endIndex, (int32_t)fPatternLength, (void *)fRXPat->fPattern->chunkContents);

                    if (endIndex == pos) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    }
                    fCharNum += endIndex - pos;
                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, endIndex);
                } else {
                    int32_t offset = 0;
                    struct URegexUTextUnescapeCharContext context = U_REGEX_UTEXT_UNESCAPE_CONTEXT(fRXPat->fPattern);

                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, pos);
                    c.fChar = u_unescapeAt(uregex_utext_unescape_charAt, &offset, INT32_MAX, &context);

                    if (offset == 0) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    } else if (context.lastOffset == offset) {
                        UTEXT_PREVIOUS32(fRXPat->fPattern);
                    } else if (context.lastOffset != offset-1) {
                        utext_moveIndex32(fRXPat->fPattern, offset - context.lastOffset - 1);
                    }
                    fCharNum += offset;
                }
            }
            else if (peekCharLL() == chDigit0) {
                //  Octal Escape, using Java Regexp Conventions
                //    which are \0 followed by 1-3 octal digits.
                //    Different from ICU Unescape handling of Octal, which does not
                //    require the leading 0.
                //  Java also has the convention of only consuming 2 octal digits if
                //    the three digit number would be > 0xff
                //
                c.fChar = 0;
                nextCharLL();    // Consume the initial 0.
                int index;
                for (index=0; index<3; index++) {
                    int32_t ch = peekCharLL();
                    if (ch<chDigit0 || ch>chDigit7) {
                        if (index==0) {
                           // \0 is not followed by any octal digits.
                           error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                        }
                        break;
                    }
                    c.fChar <<= 3;
                    c.fChar += ch&7;
                    if (c.fChar <= 255) {
                        nextCharLL();
                    } else {
                        // The last digit made the number too big.  Forget we saw it.
                        c.fChar >>= 3;
                    }
                }
                c.fQuoted = TRUE;
            }
            else if (peekCharLL() == chQ) {
                //  "\Q"  enter quote mode, which will continue until "\E"
                fQuoteMode = TRUE;
                nextCharLL();       // discard the 'Q'.
                nextChar(c);        // recurse to get the real next char.
            }
            else
            {
                // We are in a '\' escape that will be handled by the state table scanner.
                // Just return the backslash, but remember that the following char is to
                //  be taken literally.
                fInBackslashQuote = TRUE;
            }
        }
    }

    // re-enable # to end-of-line comments, in case they were disabled.
    // They are disabled by the parser upon seeing '(?', but this lasts for
    //  the fetching of the next character only.
    fEOLComments = TRUE;

    // putc(c.fChar, stdout);
}